

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamSummary.h
# Opt level: O3

void __thiscall StreamSummary<4U>::StreamSummary(StreamSummary<4U> *this,uint32_t _SIZE)

{
  StreamBucket *pSVar1;
  
  this->SIZE = _SIZE;
  (this->mp)._M_h._M_buckets = &(this->mp)._M_h._M_single_bucket;
  (this->mp)._M_h._M_bucket_count = 1;
  (this->mp)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mp)._M_h._M_element_count = 0;
  (this->mp)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mp)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mp)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pSVar1 = (StreamBucket *)operator_new(0x20);
  (pSVar1->super_Node<int>).ID = 0;
  (pSVar1->super_Node<int>).prev = (Node<int> *)0x0;
  (pSVar1->super_Node<int>).next = (Node<int> *)0x0;
  pSVar1->child = (StreamCounter *)0x0;
  this->min_bucket = pSVar1;
  return;
}

Assistant:

StreamSummary(uint32_t _SIZE) : SIZE(_SIZE), min_bucket(new StreamBucket()) {}